

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int * __thiscall google::protobuf::RepeatedField<int>::Get(RepeatedField<int> *this,int index)

{
  return (int *)((long)index * 4 + (long)this->arena_or_elements_);
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return elements()[index];
}